

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

void __thiscall
r_exec::IPGMContext::copy_structure<r_exec::View>
          (IPGMContext *this,View *destination,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr,int64_t pgm_index)

{
  char cVar1;
  bool bVar2;
  uint16_t uVar3;
  ushort uVar4;
  short sVar5;
  int iVar6;
  Atom *pAVar7;
  Atom *pAVar8;
  bool local_1b1;
  bool local_119;
  undefined1 local_118 [8];
  IPGMContext c_2;
  ulong uStack_e0;
  uint16_t i_3;
  int64_t _pgm_index;
  IPGMContext c_1;
  ushort local_a0;
  ushort local_9e;
  Atom local_9c [2];
  uint16_t i_2;
  uint16_t i_1;
  uint16_t i;
  undefined4 local_94;
  ushort local_8e;
  Atom a;
  uint16_t atom_count;
  undefined1 local_80 [8];
  IPGMContext c;
  Operator local_48;
  ulong local_38;
  int64_t pgm_index_local;
  uint16_t *puStack_28;
  bool dereference_cptr_local;
  uint16_t *extent_index_local;
  View *pVStack_18;
  uint16_t write_index_local;
  View *destination_local;
  IPGMContext *this_local;
  
  local_38 = pgm_index;
  pgm_index_local._7_1_ = dereference_cptr;
  puStack_28 = extent_index;
  extent_index_local._6_2_ = write_index;
  pVStack_18 = destination;
  destination_local = (View *)this;
  operator[](this,0);
  cVar1 = r_code::Atom::getDescriptor();
  c.view._7_1_ = 0;
  local_119 = false;
  if (cVar1 == -0x3b) {
    operator[](this,0);
    uVar3 = r_code::Atom::asOpcode();
    Operator::Get(&local_48,uVar3);
    c.view._7_1_ = 1;
    local_119 = Operator::is_syn(&local_48);
  }
  if ((c.view._7_1_ & 1) != 0) {
    Operator::~Operator(&local_48);
  }
  if (local_119 != false) {
    getChild((IPGMContext *)local_80,this,1);
    copy_member<r_exec::View>
              ((IPGMContext *)local_80,pVStack_18,extent_index_local._6_2_,puStack_28,
               (bool)(pgm_index_local._7_1_ & 1),local_38);
    ~IPGMContext((IPGMContext *)local_80);
    return;
  }
  pAVar7 = operator[](this,0);
  uVar3 = extent_index_local._6_2_;
  extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
  pAVar8 = r_code::View::code(&pVStack_18->super_View,uVar3);
  r_code::Atom::operator=(pAVar8,pAVar7);
  iVar6 = (*(this->super__Context)._vptr__Context[6])();
  local_8e = (ushort)iVar6;
  *puStack_28 = extent_index_local._6_2_ + local_8e;
  operator[](this,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x40) {
    operator[](this,1);
    cVar1 = r_code::Atom::getDescriptor();
    if (cVar1 == -0x7a) {
      pAVar7 = (this->super__Context).code;
      operator[](this,1);
      uVar4 = r_code::Atom::asIndex();
      local_94 = *(undefined4 *)(pAVar7 + (ulong)uVar4 * 4);
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x7c) {
        pAVar7 = (this->super__Context).code;
        uVar4 = r_code::Atom::asIndex();
        r_code::Atom::operator=((Atom *)&local_94,pAVar7 + (ulong)uVar4 * 4);
      }
      cVar1 = r_code::Atom::getDescriptor();
      if (cVar1 == -0x78) {
        r_code::Atom::asInputIndex();
        r_code::Atom::RPointer((ushort)local_9c);
        uVar3 = extent_index_local._6_2_;
        extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
        pAVar7 = r_code::View::code(&pVStack_18->super_View,uVar3);
        r_code::Atom::operator=(pAVar7,local_9c);
        r_code::Atom::~Atom(local_9c);
      }
      else if (cVar1 == -0x75) {
        operator[](this,1);
        r_code::Atom::asIndex();
        uVar4 = r_code::Atom::asIndex();
        r_code::Atom::VLPointer((ushort)&i_1,uVar4);
        uVar3 = extent_index_local._6_2_;
        extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
        pAVar7 = r_code::View::code(&pVStack_18->super_View,uVar3);
        r_code::Atom::operator=(pAVar7,(Atom *)&i_1);
        r_code::Atom::~Atom((Atom *)&i_1);
      }
      else {
        pAVar7 = operator[](this,1);
        uVar3 = extent_index_local._6_2_;
        extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
        pAVar8 = r_code::View::code(&pVStack_18->super_View,uVar3);
        r_code::Atom::operator=(pAVar8,pAVar7);
      }
      r_code::Atom::~Atom((Atom *)&local_94);
    }
    else {
      pAVar7 = operator[](this,1);
      uVar3 = extent_index_local._6_2_;
      extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
      pAVar8 = r_code::View::code(&pVStack_18->super_View,uVar3);
      r_code::Atom::operator=(pAVar8,pAVar7);
    }
    for (local_9e = 2; local_9e <= local_8e; local_9e = local_9e + 1) {
      pAVar7 = operator[](this,local_9e);
      uVar3 = extent_index_local._6_2_;
      extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
      pAVar8 = r_code::View::code(&pVStack_18->super_View,uVar3);
      r_code::Atom::operator=(pAVar8,pAVar7);
    }
    return;
  }
  if (cVar1 == -0x39) {
    for (local_a0 = 1; local_a0 <= local_8e; local_a0 = local_a0 + 1) {
      pAVar7 = operator[](this,local_a0);
      uVar3 = extent_index_local._6_2_;
      extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
      pAVar8 = r_code::View::code(&pVStack_18->super_View,uVar3);
      r_code::Atom::operator=(pAVar8,pAVar7);
    }
    return;
  }
  bVar2 = is_cmd_with_cptr(this);
  if (bVar2) {
    for (c_1.view._6_2_ = 1; c_1.view._6_2_ <= local_8e; c_1.view._6_2_ = c_1.view._6_2_ + 1) {
      getChild((IPGMContext *)&_pgm_index,this,c_1.view._6_2_);
      uVar3 = extent_index_local._6_2_;
      extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
      copy_member<r_exec::View>
                ((IPGMContext *)&_pgm_index,pVStack_18,uVar3,puStack_28,c_1.view._6_2_ != 2,local_38
                );
      ~IPGMContext((IPGMContext *)&_pgm_index);
    }
    return;
  }
  if (-1 < (long)local_38) {
    uStack_e0 = local_38;
    goto LAB_0029c503;
  }
  operator[](this,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x3d) {
    operator[](this,0);
    sVar5 = r_code::Atom::asOpcode();
    if (sVar5 != Opcodes::Pgm) {
      operator[](this,0);
      sVar5 = r_code::Atom::asOpcode();
      if (sVar5 != Opcodes::AntiPgm) goto LAB_0029c4f6;
    }
    uStack_e0 = (ulong)(this->super__Context).index;
  }
  else {
LAB_0029c4f6:
    uStack_e0 = 0xffffffffffffffff;
  }
LAB_0029c503:
  for (c_2.view._6_2_ = 1; c_2.view._6_2_ <= local_8e; c_2.view._6_2_ = c_2.view._6_2_ + 1) {
    getChild((IPGMContext *)local_118,this,c_2.view._6_2_);
    uVar3 = extent_index_local._6_2_;
    extent_index_local._6_2_ = extent_index_local._6_2_ + 1;
    local_1b1 = (pgm_index_local._7_1_ & 1) == 0 && c_2.view._6_2_ == 1;
    copy_member<r_exec::View>
              ((IPGMContext *)local_118,pVStack_18,uVar3,puStack_28,(bool)(~local_1b1 & 1),uStack_e0
              );
    ~IPGMContext((IPGMContext *)local_118);
  }
  return;
}

Assistant:

void copy_structure(C *destination,
                                          uint16_t write_index,
                                          uint16_t &extent_index,
                                          bool dereference_cptr,
                                          int64_t pgm_index) const   // assumes the context is a structure; C: Object or View.
    {
        if ((*this)[0].getDescriptor() == Atom::OPERATOR && Operator::Get((*this)[0].asOpcode()).is_syn()) { // (\ (expression ...)).
            IPGMContext c = getChild(1);
            c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
        } else {
            destination->code(write_index++) = (*this)[0];
            uint16_t atom_count = getChildrenCount();
            extent_index = write_index + atom_count;

            switch ((*this)[0].getDescriptor()) {
            case Atom::C_PTR: // copy members as is (no dereference).
                if ((*this)[1].getDescriptor() == Atom::VL_PTR) {
                    Atom a = code[(*this)[1].asIndex()];

                    if (a.getDescriptor() == Atom::I_PTR) {
                        a = code[a.asIndex()];
                    }

                    switch (a.getDescriptor()) {
                    case Atom::OUT_OBJ_PTR:
                        destination->code(write_index++) = Atom::VLPointer(code[(*this)[1].asIndex()].asIndex());
                        break;

                    case Atom::IN_OBJ_PTR: // TMP: assumes destination is a mk.rdx.
                        destination->code(write_index++) = Atom::RPointer(1 + a.asInputIndex());
                        break;

                    default:
                        destination->code(write_index++) = (*this)[1];
                        break;
                    }
                } else {
                    destination->code(write_index++) = (*this)[1];
                }

                for (uint16_t i = 2; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            case Atom::TIMESTAMP: // copy members as is (no dereference).
                for (uint16_t i = 1; i <= atom_count; ++i) {
                    destination->code(write_index++) = (*this)[i];
                }

                break;

            default:
                if (is_cmd_with_cptr()) {
                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, i != 2, pgm_index);
                    }
                } else { // if a pgm is being copied, indicate the starting index of the pgm so that we can turn on code patching and know if a cptr is referencing code inside the pgm (in that case it will not be dereferenced).
                    int64_t _pgm_index;

                    if (pgm_index >= 0) {
                        _pgm_index = pgm_index;
                    } else if ((*this)[0].getDescriptor() == Atom::OBJECT && ((*this)[0].asOpcode() == Opcodes::Pgm || (*this)[0].asOpcode() == Opcodes::AntiPgm)) {
                        _pgm_index = index;
                    } else {
                        _pgm_index = -1;
                    }

                    for (uint16_t i = 1; i <= atom_count; ++i) {
                        IPGMContext c = getChild(i);
                        c.copy_member(destination, write_index++, extent_index, !(!dereference_cptr && i == 1), _pgm_index);
                    }
                }

                break;
            }
        }
    }